

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

int __thiscall cs_impl::math_cs_ext::rand(math_cs_ext *this)

{
  unkbyte10 in_ST0;
  
  cov::random::random_traits<long_double,_false>::rand();
  this[0x10] = (math_cs_ext)0x0;
  *(unkbyte10 *)this = in_ST0;
  return (int)this;
}

Assistant:

numeric rand(const numeric& b, const numeric& e)
		{
			return cov::rand<numeric_float>(b.as_float(), e.as_float());
		}